

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerTests.cpp
# Opt level: O0

void __thiscall agge::WorkerTests::WorkerTests(WorkerTests *this)

{
  WorkerTests *this_local;
  
  ut::
  test_case_registrar<agge::WorkerTests,_&agge::WorkerTests::__WorkPutIsProcessedAndCanBeRead_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::WorkerTests,_&agge::WorkerTests::__WorkPutIsProcessedAndCanBeRead_meta>
              *)this);
  return;
}

Assistant:

test( WorkPutIsProcessedAndCanBeRead )
		{
			// INIT
			hybrid_event input_ready, output_ready;
			worker< pair<int, double> >::in_queue_type input(input_ready);
			worker< pair<int, double> >::out_queue_type output(output_ready);
			worker< pair<int, double> > w(input, output);
			consumer c;

			// ACT
			input.produce(work<12>(1.2345));

			// ACT / ASERT
			output.consume(c);

			// ASSERT
			assert_equal(make_pair(12, 1.2345), c.value);

			// ACT
			input.produce(work<13>(3.14956));

			// ACT / ASERT
			output.consume(c);

			// ASSERT
			assert_equal(make_pair(13, 3.14956), c.value);
		}